

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_json_parser.c
# Opt level: O0

void gen_enum_match(fb_output_t *out,fb_compound_type_t *ct,void *data,int hint,int n)

{
  int n_local;
  int hint_local;
  void *data_local;
  fb_compound_type_t *ct_local;
  fb_output_t *out_local;
  
  println(out,"buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, %d, aggregate);",
          (ulong)(uint)n);
  println(out,"if (buf != mark) {");
  out->indent = out->indent + 1;
  gen_enum_match_handler(out,ct,data,hint);
  if (out->indent != 0) {
    out->indent = out->indent + -1;
    println(out,"} else {");
    out->indent = out->indent + 1;
    return;
  }
  __assert_fail("out->indent",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                ,0x304,"void gen_enum_match(fb_output_t *, fb_compound_type_t *, void *, int, int)")
  ;
}

Assistant:

static void gen_enum_match(fb_output_t *out, fb_compound_type_t *ct, void *data, int hint, int n)
{
    println(out, "buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, %d, aggregate);", n);
    println(out, "if (buf != mark) {"); indent();
    gen_enum_match_handler(out, ct, data, hint);
    unindent(); println(out, "} else {"); indent();
}